

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

void __thiscall
S2Polyline::Init(S2Polyline *this,
                vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  ulong uVar5;
  Vector3<double> *__p;
  type __result;
  ostream *poVar6;
  Vector3<double> *local_80;
  S2LogMessage local_50;
  S2LogMessageVoidify local_39;
  __normal_iterator<const_Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
  local_38;
  __normal_iterator<const_Vector3<double>_*,_std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>
  local_30;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *local_18;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices_local;
  S2Polyline *this_local;
  
  local_18 = vertices;
  vertices_local = (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)this;
  sVar3 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size(vertices);
  this->num_vertices_ = (int)sVar3;
  uVar4 = (ulong)this->num_vertices_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  uVar5 = SUB168(auVar1 * ZEXT816(0x18),0);
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __p = (Vector3<double> *)operator_new__(uVar5);
  if (uVar4 != 0) {
    local_80 = __p;
    do {
      Vector3<double>::Vector3(local_80);
      local_80 = local_80 + 1;
    } while (local_80 != __p + uVar4);
  }
  std::unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>>::
  reset<Vector3<double>*,void>
            ((unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>> *)
             &this->vertices_,__p);
  local_30._M_current =
       (Vector3<double> *)
       std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::begin(local_18);
  local_38._M_current =
       (Vector3<double> *)
       std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::end(local_18);
  __result = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::operator[]
                       (&this->vertices_,0);
  std::
  copy<__gnu_cxx::__normal_iterator<Vector3<double>const*,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>,Vector3<double>*>
            (local_30,local_38,__result);
  if ((((FLAGS_s2debug & 1U) != 0) && (this->s2debug_override_ == ALLOW)) &&
     (bVar2 = IsValid(this), ((bVar2 ^ 0xffU) & 1) != 0)) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.cc"
               ,0x66,kFatal,(ostream *)&std::cerr);
    poVar6 = S2LogMessage::stream(&local_50);
    poVar6 = std::operator<<(poVar6,"Check failed: IsValid() ");
    S2LogMessageVoidify::operator&(&local_39,poVar6);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
  }
  return;
}

Assistant:

void S2Polyline::Init(const vector<S2Point>& vertices) {
  num_vertices_ = vertices.size();
  vertices_.reset(new S2Point[num_vertices_]);
  std::copy(vertices.begin(), vertices.end(), &vertices_[0]);
  if (FLAGS_s2debug && s2debug_override_ == S2Debug::ALLOW) {
    S2_CHECK(IsValid());
  }
}